

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O0

int XMLDoc_parse_buffer_SAX_len
              (SXML_CHAR *buffer,int buffer_len,SXML_CHAR *name,SAX_Callbacks *sax,void *user)

{
  undefined1 local_70 [8];
  SAX_Data sd;
  DataSourceBuffer dsb;
  void *user_local;
  SAX_Callbacks *sax_local;
  SXML_CHAR *name_local;
  int buffer_len_local;
  SXML_CHAR *buffer_local;
  
  sd.src = buffer;
  memset(local_70,0,0x28);
  if ((sax == (SAX_Callbacks *)0x0) || (buffer == (SXML_CHAR *)0x0)) {
    buffer_local._4_4_ = 0;
  }
  else {
    sd.user._0_4_ = 1;
    local_70 = (undefined1  [8])name;
    sd._8_8_ = user;
    sd._24_8_ = buffer;
    buffer_local._4_4_ = _parse_data_SAX(&sd.src,DATA_SOURCE_BUFFER,sax,(SAX_Data *)local_70);
  }
  return buffer_local._4_4_;
}

Assistant:

int XMLDoc_parse_buffer_SAX_len(const SXML_CHAR* buffer, int buffer_len, const SXML_CHAR* name, const SAX_Callbacks* sax, void* user)
{
	DataSourceBuffer dsb = { buffer, buffer_len, 0 };
	SAX_Data sd = { NULL };

	if (sax == NULL || buffer == NULL)
		return FALSE;

	sd.name = name;
	sd.user = user;
	sd.type = DATA_SOURCE_BUFFER;
	sd.src  = (void*)buffer;
	return _parse_data_SAX((void*)&dsb, DATA_SOURCE_BUFFER, sax, &sd);
}